

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UBool __thiscall icu_63::UnicodeSet::matchesIndexValue(UnicodeSet *this,uint8_t v)

{
  uint uVar1;
  ulong uVar2;
  UChar32 UVar3;
  ulong uVar4;
  UnicodeString *this_00;
  ulong uVar5;
  uint uVar6;
  int index;
  undefined7 in_register_00000031;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar2 = (long)this->len / 2;
  uVar5 = 0;
  uVar4 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = this->list[uVar5 * 2];
    uVar7 = this->list[uVar5 * 2 + 1] - 1;
    uVar9 = uVar1 & 0xff;
    uVar8 = uVar7 & 0xff;
    uVar6 = (uint)CONCAT71(in_register_00000031,v);
    if ((uVar7 ^ uVar1) < 0x100) {
      if ((uVar9 <= uVar6) && (uVar6 <= uVar8)) goto LAB_002cecc9;
    }
    else {
      index = 1;
      if ((uVar9 <= uVar6) || (uVar6 <= uVar8)) goto LAB_002cecd0;
    }
  }
  index = 0;
  if (this->strings->count != 0) {
    do {
      if (this->strings->count <= index) {
        index = 0;
        goto LAB_002cecd0;
      }
      this_00 = (UnicodeString *)UVector::elementAt(this->strings,index);
      UVar3 = UnicodeString::char32At(this_00,0);
      index = index + 1;
    } while ((uint8_t)UVar3 != v);
LAB_002cecc9:
    index = 1;
  }
LAB_002cecd0:
  return (UBool)index;
}

Assistant:

UBool UnicodeSet::matchesIndexValue(uint8_t v) const {
    /* The index value v, in the range [0,255], is contained in this set if
     * it is contained in any pair of this set.  Pairs either have the high
     * bytes equal, or unequal.  If the high bytes are equal, then we have
     * aaxx..aayy, where aa is the high byte.  Then v is contained if xx <=
     * v <= yy.  If the high bytes are unequal we have aaxx..bbyy, bb>aa.
     * Then v is contained if xx <= v || v <= yy.  (This is identical to the
     * time zone month containment logic.)
     */
    int32_t i;
    int32_t rangeCount=getRangeCount();
    for (i=0; i<rangeCount; ++i) {
        UChar32 low = getRangeStart(i);
        UChar32 high = getRangeEnd(i);
        if ((low & ~0xFF) == (high & ~0xFF)) {
            if ((low & 0xFF) <= v && v <= (high & 0xFF)) {
                return TRUE;
            }
        } else if ((low & 0xFF) <= v || v <= (high & 0xFF)) {
            return TRUE;
        }
    }
    if (strings->size() != 0) {
        for (i=0; i<strings->size(); ++i) {
            const UnicodeString& s = *(const UnicodeString*)strings->elementAt(i);
            //if (s.length() == 0) {
            //    // Empty strings match everything
            //    return TRUE;
            //}
            // assert(s.length() != 0); // We enforce this elsewhere
            UChar32 c = s.char32At(0);
            if ((c & 0xFF) == v) {
                return TRUE;
            }
        }
    }
    return FALSE;
}